

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void mi_page_free_list_extend(mi_page_t *page,size_t bsize,size_t extend,mi_stats_t *stats)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint8_t *puVar3;
  mi_block_t *pmVar4;
  
  puVar1 = page->page_start;
  uVar2 = (ulong)page->capacity;
  puVar3 = puVar1 + (uVar2 + 1) * bsize;
  for (pmVar4 = (mi_block_t *)(puVar1 + uVar2 * bsize);
      pmVar4 <= (mi_block_t *)(puVar1 + (extend + uVar2 + -1) * bsize);
      pmVar4 = (mi_block_t *)((long)&pmVar4->next + bsize)) {
    pmVar4->next = (mi_encoded_t)puVar3;
    puVar3 = puVar3 + bsize;
  }
  ((mi_block_t *)(puVar1 + (extend + uVar2 + -1) * bsize))->next = (mi_encoded_t)page->free;
  page->free = (mi_block_t *)(puVar1 + uVar2 * bsize);
  return;
}

Assistant:

static inline uint8_t* mi_page_start(const mi_page_t* page) {
  mi_assert_internal(page->page_start != NULL);
  mi_assert_expensive(_mi_segment_page_start(_mi_page_segment(page),page,NULL) == page->page_start);
  return page->page_start;
}